

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void Memory::Recycler::WBSetBitRange(char *addr,uint count)

{
  HeapBlock *pHVar1;
  Recycler *pRVar2;
  
  if ((Js::Configuration::Global[0x2c156] == '\x01') &&
     (Js::Configuration::Global[0x2c157] == '\x01')) {
    CCLock::Enter(&recyclerListLock.super_CCLock);
    for (pRVar2 = recyclerList; pRVar2 != (Recycler *)0x0; pRVar2 = pRVar2->next) {
      if (addr < (char *)0x10000) {
        pHVar1 = (HeapBlock *)0x0;
      }
      else {
        pHVar1 = HeapBlockMap64::GetHeapBlock
                           (&pRVar2->heapBlockMap,(void *)((ulong)addr & 0xfffffffffffffff0));
      }
      if (pHVar1 != (HeapBlock *)0x0) {
        (*pHVar1->_vptr_HeapBlock[1])(pHVar1,addr,count);
        break;
      }
    }
    CCLock::Leave(&recyclerListLock.super_CCLock);
  }
  return;
}

Assistant:

void
Recycler::WBSetBitRange(char* addr, uint count)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        AutoCriticalSection lock(&recyclerListLock);
        Recycler* recycler = Recycler::recyclerList;
        while (recycler)
        {
            auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
            if (heapBlock)
            {
                heapBlock->WBSetBitRange(addr, count);
                break;
            }
            recycler = recycler->next;
        }
    }
}